

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::CuePoint::Load(CuePoint *this,IMkvReader *pReader)

{
  long lVar1;
  undefined1 auVar2 [16];
  CuePoint *pCVar3;
  bool bVar4;
  longlong lVar5;
  longlong lVar6;
  long lVar7;
  ulong uVar8;
  long pos;
  long lVar9;
  long len;
  TrackPosition *tp;
  long local_58;
  CuePoint *local_50;
  TrackPosition *local_48;
  longlong local_40;
  long local_38;
  
  lVar1 = this->m_timecode;
  bVar4 = true;
  if (lVar1 < 0) {
    lVar5 = ReadID(pReader,-lVar1,&local_58);
    if (lVar5 == 0xbb) {
      lVar7 = local_58 - lVar1;
      lVar5 = ReadUInt(pReader,lVar7,&local_58);
      if (lVar5 < 1) {
        this->m_track_positions_count = 0;
      }
      else {
        lVar7 = lVar7 + local_58;
        lVar9 = lVar5 + lVar7;
        uVar8 = 0;
        local_50 = this;
        local_40 = -lVar1;
        local_38 = lVar7;
        do {
          lVar5 = ReadID(pReader,lVar7,&local_58);
          if ((((lVar5 < 0) || (lVar7 = lVar7 + local_58, lVar9 < lVar7)) ||
              (lVar6 = ReadUInt(pReader,lVar7,&local_58), lVar6 < 0)) ||
             ((pos = lVar7 + local_58, lVar9 < pos || (lVar7 = pos + lVar6, lVar9 < lVar7))))
          goto LAB_001571aa;
          if (lVar5 == 0xb7) {
            uVar8 = uVar8 + 1;
            if (uVar8 >> 0x20 != 0) {
              return true;
            }
          }
          else if (lVar5 == 0xb3) {
            lVar5 = UnserializeUInt(pReader,pos,lVar6);
            local_50->m_timecode = lVar5;
          }
          pCVar3 = local_50;
        } while (lVar7 < lVar9);
        local_50->m_track_positions_count = uVar8;
        if (uVar8 != 0 && -1 < local_50->m_timecode) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar8;
          uVar8 = 0xffffffffffffffff;
          if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
            uVar8 = SUB168(auVar2 * ZEXT816(0x18),0);
          }
          local_48 = (TrackPosition *)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
          pCVar3->m_track_positions = local_48;
          lVar7 = local_38;
          if (local_48 != (TrackPosition *)0x0) {
            do {
              if (lVar9 <= lVar7) {
                local_50->m_element_start = local_40;
                local_50->m_element_size = lVar1 + lVar9;
                return true;
              }
              lVar5 = ReadID(pReader,lVar7,&local_58);
              if ((lVar5 < 0) || (lVar7 = lVar7 + local_58, lVar9 < lVar7)) break;
              lVar6 = ReadUInt(pReader,lVar7,&local_58);
              lVar7 = lVar7 + local_58;
              if (lVar5 == 0xb7) {
                bVar4 = TrackPosition::Parse(local_48,pReader,lVar7,lVar6);
                if (!bVar4) break;
                local_48 = local_48 + 1;
              }
              lVar7 = lVar7 + lVar6;
              if (lVar9 < lVar7) {
                return false;
              }
            } while( true );
          }
        }
      }
    }
LAB_001571aa:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool CuePoint::Load(IMkvReader* pReader) {
  // odbgstream os;
  // os << "CuePoint::Load(begin): timecode=" << m_timecode << endl;

  if (m_timecode >= 0)  // already loaded
    return true;

  assert(m_track_positions == NULL);
  assert(m_track_positions_count == 0);

  long long pos_ = -m_timecode;
  const long long element_start = pos_;

  long long stop;

  {
    long len;

    const long long id = ReadID(pReader, pos_, len);
    if (id != libwebm::kMkvCuePoint)
      return false;

    pos_ += len;  // consume ID

    const long long size = ReadUInt(pReader, pos_, len);
    assert(size >= 0);

    pos_ += len;  // consume Size field
    // pos_ now points to start of payload

    stop = pos_ + size;
  }

  const long long element_size = stop - element_start;

  long long pos = pos_;

  // First count number of track positions
  unsigned long long track_positions_count = 0;
  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if ((id < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if ((size < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if ((pos + size) > stop) {
      return false;
    }

    if (id == libwebm::kMkvCueTime)
      m_timecode = UnserializeUInt(pReader, pos, size);

    else if (id == libwebm::kMkvCueTrackPositions) {
      ++track_positions_count;
      if (track_positions_count > UINT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
  }

  m_track_positions_count = static_cast<size_t>(track_positions_count);

  if (m_timecode < 0 || m_track_positions_count <= 0) {
    return false;
  }

  // os << "CuePoint::Load(cont'd): idpos=" << idpos
  //   << " timecode=" << m_timecode
  //   << endl;

  m_track_positions = new (std::nothrow) TrackPosition[m_track_positions_count];
  if (m_track_positions == NULL)
    return false;

  // Now parse track positions

  TrackPosition* p = m_track_positions;
  pos = pos_;

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return false;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);
    assert((pos + len) <= stop);

    pos += len;  // consume Size field
    assert((pos + size) <= stop);

    if (id == libwebm::kMkvCueTrackPositions) {
      TrackPosition& tp = *p++;
      if (!tp.Parse(pReader, pos, size)) {
        return false;
      }
    }

    pos += size;  // consume payload
    if (pos > stop)
      return false;
  }

  assert(size_t(p - m_track_positions) == m_track_positions_count);

  m_element_start = element_start;
  m_element_size = element_size;

  return true;
}